

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall
cfd::TransactionContext::SplitTxOut
          (TransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *address_list)

{
  pointer pAVar1;
  pointer pAVar2;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> locking_script_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_88;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *local_70;
  Script local_68;
  
  local_88.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar2 = (address_list->
           super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = (address_list->
           super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_70 = amount_list;
  if (pAVar2 != pAVar1) {
    do {
      cfd::core::Address::GetLockingScript();
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::
      emplace_back<cfd::core::Script>(&local_88,&local_68);
      core::Script::~Script(&local_68);
      pAVar2 = pAVar2 + 0x178;
    } while (pAVar2 != pAVar1);
  }
  SplitTxOut(this,index,local_70,&local_88);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_88);
  return;
}

Assistant:

void TransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Address>& address_list) {
  std::vector<Script> locking_script_list;
  for (const auto& addr : address_list) {
    locking_script_list.emplace_back(addr.GetLockingScript());
  }
  SplitTxOut(index, amount_list, locking_script_list);
}